

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::DuplicateRowsPS::DuplicateRowsPS
          (DuplicateRowsPS *this,SPxLPBase<double> *lp,int _i,int maxLhsIdx,int minRhsIdx,
          DSVectorBase<double> *dupRows,Array<double> *scale,DataArray<int> *perm,
          DataArray<bool> *isLhsEqualRhs,bool isTheLast,bool isFixedRow,
          shared_ptr<soplex::Tolerances> *tols,bool isFirst)

{
  SPxSense SVar1;
  int iVar2;
  char *pcVar3;
  int *piVar4;
  int in_ECX;
  undefined4 in_EDX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  SPxLPBase<double> *in_RSI;
  undefined8 *in_RDI;
  int in_R8D;
  long in_R9;
  double dVar5;
  byte in_stack_00000020;
  byte in_stack_00000028;
  byte in_stack_00000038;
  int k;
  double rowScale;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  SPxLPBase<double> *in_stack_fffffffffffffed0;
  SPxLPBase<double> *in_stack_fffffffffffffed8;
  int i;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffee8;
  PostStep *in_stack_fffffffffffffef0;
  int local_cc;
  int local_bc;
  uint local_6c;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffed0,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2918f4);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x29190a);
  PostStep::PostStep(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     (shared_ptr<soplex::Tolerances> *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8)
  ;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x29194b);
  *in_RDI = &PTR__DuplicateRowsPS_00897bd8;
  *(undefined4 *)(in_RDI + 5) = in_EDX;
  dVar5 = SPxLPBase<double>::rowObj
                    (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  in_RDI[6] = dVar5;
  local_bc = in_ECX;
  if (in_ECX == -1) {
    local_bc = -1;
  }
  *(int *)(in_RDI + 7) = local_bc;
  local_cc = in_R8D;
  if (in_R8D == -1) {
    local_cc = -1;
  }
  *(int *)((long)in_RDI + 0x3c) = local_cc;
  SVar1 = SPxLPBase<double>::spxSense(in_RSI);
  *(bool *)(in_RDI + 8) = SVar1 == MAXIMIZE;
  *(byte *)((long)in_RDI + 0x41) = in_stack_00000038 & 1;
  *(byte *)((long)in_RDI + 0x42) = in_stack_00000020 & 1;
  *(byte *)((long)in_RDI + 0x43) = in_stack_00000028 & 1;
  iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x291a5d);
  *(int *)((long)in_RDI + 0x44) = iVar2;
  SVectorBase<double>::size((SVectorBase<double> *)(in_R9 + 8));
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  SVectorBase<double>::size((SVectorBase<double> *)(in_R9 + 8));
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  SVectorBase<double>::size((SVectorBase<double> *)(in_R9 + 8));
  DataArray<int>::DataArray
            ((DataArray<int> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(int)in_stack_fffffffffffffed8,
             (Real)in_stack_fffffffffffffed0);
  DataArray<int>::DataArray
            ((DataArray<int> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (DataArray<int> *)in_stack_fffffffffffffed8);
  DataArray<bool>::DataArray
            ((DataArray<bool> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (DataArray<bool> *)in_stack_fffffffffffffed8);
  Array<double>::operator[]((Array<double> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  local_6c = 0;
  while( true ) {
    i = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    iVar2 = SVectorBase<double>::size((SVectorBase<double> *)(in_R9 + 8));
    if (iVar2 <= (int)local_6c) break;
    SVectorBase<double>::index((SVectorBase<double> *)(in_R9 + 8),(char *)(ulong)local_6c,__c);
    SVectorBase<double>::index((SVectorBase<double> *)(in_R9 + 8),(char *)(ulong)local_6c,__c_00);
    Array<double>::operator[]((Array<double> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    DSVectorBase<double>::add
              ((DSVectorBase<double> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
               ,i,(double *)in_stack_fffffffffffffed0);
    in_stack_fffffffffffffed8 = (SPxLPBase<double> *)(in_RDI + 0xd);
    pcVar3 = SVectorBase<double>::index
                       ((SVectorBase<double> *)(in_R9 + 8),(char *)(ulong)local_6c,__c_01);
    in_stack_fffffffffffffee4 = SUB84(pcVar3,0);
    in_stack_fffffffffffffed0 = in_RSI;
    SVectorBase<double>::index((SVectorBase<double> *)(in_R9 + 8),(char *)(ulong)local_6c,__c_02);
    SPxLPBase<double>::rowObj
              (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20));
    DSVectorBase<double>::add
              ((DSVectorBase<double> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
               ,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),(double *)in_stack_fffffffffffffed0)
    ;
    pcVar3 = SVectorBase<double>::index
                       ((SVectorBase<double> *)(in_R9 + 8),(char *)(ulong)local_6c,__c_03);
    in_stack_fffffffffffffecc = (int)pcVar3;
    piVar4 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x11),local_6c);
    *piVar4 = in_stack_fffffffffffffecc;
    local_6c = local_6c + 1;
  }
  return;
}

Assistant:

DuplicateRowsPS(const SPxLPBase<R>& lp, int _i,
                      int maxLhsIdx, int minRhsIdx, const DSVectorBase<R>& dupRows,
                      const Array<R> scale, const DataArray<int> perm, const DataArray<bool> isLhsEqualRhs,
                      bool isTheLast, bool isFixedRow, std::shared_ptr<Tolerances> tols, bool isFirst = false)
         : PostStep("DuplicateRows", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_i_rowObj(lp.rowObj(_i))
         , m_maxLhsIdx((maxLhsIdx == -1) ? -1 : maxLhsIdx)
         , m_minRhsIdx((minRhsIdx == -1) ? -1 : minRhsIdx)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_isFirst(isFirst)
         , m_isLast(isTheLast)
         , m_fixed(isFixedRow)
         , m_nCols(lp.nCols())
         , m_scale(dupRows.size())
         , m_rowObj(dupRows.size())
         , m_rIdxLocalOld(dupRows.size())
         , m_perm(perm)
         , m_isLhsEqualRhs(isLhsEqualRhs)
      {
         R rowScale = scale[_i];

         for(int k = 0; k < dupRows.size(); ++k)
         {
            m_scale.add(dupRows.index(k), rowScale / scale[dupRows.index(k)]);
            m_rowObj.add(dupRows.index(k), lp.rowObj(dupRows.index(k)));
            m_rIdxLocalOld[k] = dupRows.index(k);
         }
      }